

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O0

void TestDouble_AsDiyFp(void)

{
  DiyFp DVar1;
  uint64_t max_double64;
  uint64_t min_double64;
  DiyFp diy_fp;
  uint64_t ordered;
  int in_stack_ffffffffffffff3c;
  undefined1 condition;
  Double *this;
  undefined8 in_stack_ffffffffffffff48;
  int iVar2;
  Double *this_00;
  char *file;
  DiyFp *this_01;
  int line;
  char *file_00;
  Double local_80;
  uint64_t local_78;
  int32_t local_70;
  undefined8 local_68;
  uint64_t local_60;
  int32_t local_58;
  Double local_50;
  uint64_t local_48;
  int32_t local_40;
  undefined8 local_38;
  uint64_t local_30;
  int32_t local_28;
  Double local_20;
  DiyFp local_18;
  undefined8 local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = 0x123456789abcdef;
  this = &local_20;
  double_conversion::Double::Double(this,0x123456789abcdef);
  DVar1 = double_conversion::Double::AsDiyFp(this);
  local_30 = DVar1.f_;
  local_28 = DVar1.e_;
  this_01 = &local_18;
  local_18.f_ = local_30;
  local_18.e_ = local_28;
  double_conversion::DiyFp::e(this_01);
  file_00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-ieee.cc"
  ;
  file = "diy_fp.e()";
  CheckEqualsHelper("/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-ieee.cc"
                    ,(int)((ulong)this_01 >> 0x20),"diy_fp.e()",iVar2,(char *)this,
                    in_stack_ffffffffffffff3c);
  double_conversion::DiyFp::f(this_01);
  CheckHelper(file,iVar2,(char *)this,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  local_38 = 1;
  this_00 = &local_50;
  double_conversion::Double::Double(this_00,1);
  iVar2 = (int)((ulong)this_00 >> 0x20);
  DVar1 = double_conversion::Double::AsDiyFp(this);
  local_60 = DVar1.f_;
  local_58 = DVar1.e_;
  local_48 = local_60;
  local_40 = local_58;
  local_18.f_ = local_60;
  local_18.e_ = local_58;
  double_conversion::DiyFp::e(this_01);
  CheckEqualsHelper(file_00,(int)((ulong)this_01 >> 0x20),file,iVar2,(char *)this,
                    in_stack_ffffffffffffff3c);
  double_conversion::DiyFp::f(this_01);
  line = (int)((ulong)this_01 >> 0x20);
  CheckHelper(file,iVar2,(char *)this,SUB41((uint)in_stack_ffffffffffffff3c >> 0x18,0));
  local_68 = 0x7fefffffffffffff;
  double_conversion::Double::Double(&local_80,0x7fefffffffffffff);
  DVar1 = double_conversion::Double::AsDiyFp(this);
  local_78 = DVar1.f_;
  local_70 = DVar1.e_;
  local_18.f_ = local_78;
  local_18.e_ = local_70;
  double_conversion::DiyFp::e(&local_18);
  CheckEqualsHelper(file_00,line,file,iVar2,(char *)this,in_stack_ffffffffffffff3c);
  condition = (undefined1)((uint)in_stack_ffffffffffffff3c >> 0x18);
  double_conversion::DiyFp::f(&local_18);
  CheckHelper(file,iVar2,(char *)this,(bool)condition);
  return;
}

Assistant:

TEST(Double_AsDiyFp) {
  uint64_t ordered = DOUBLE_CONVERSION_UINT64_2PART_C(0x01234567, 89ABCDEF);
  DiyFp diy_fp = Double(ordered).AsDiyFp();
  CHECK_EQ(0x12 - 0x3FF - 52, diy_fp.e());
  // The 52 mantissa bits, plus the implicit 1 in bit 52 as a UINT64.
  CHECK(DOUBLE_CONVERSION_UINT64_2PART_C(0x00134567, 89ABCDEF) == diy_fp.f());  // NOLINT

  uint64_t min_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00000000, 00000001);
  diy_fp = Double(min_double64).AsDiyFp();
  CHECK_EQ(-0x3FF - 52 + 1, diy_fp.e());
  // This is a denormal; so no hidden bit.
  CHECK(1 == diy_fp.f());  // NOLINT

  uint64_t max_double64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x7fefffff, ffffffff);
  diy_fp = Double(max_double64).AsDiyFp();
  CHECK_EQ(0x7FE - 0x3FF - 52, diy_fp.e());
  CHECK(DOUBLE_CONVERSION_UINT64_2PART_C(0x001fffff, ffffffff) == diy_fp.f());  // NOLINT
}